

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O0

int nni_dialer_hold(nni_dialer *d)

{
  int local_14;
  int rv;
  nni_dialer *d_local;
  
  nni_mtx_lock(&dialers_lk);
  if ((d->d_closed & 1U) == 0) {
    d->d_ref = d->d_ref + 1;
    local_14 = 0;
  }
  else {
    local_14 = 7;
  }
  nni_mtx_unlock(&dialers_lk);
  return local_14;
}

Assistant:

int
nni_dialer_hold(nni_dialer *d)
{
	int rv;
	nni_mtx_lock(&dialers_lk);
	if (d->d_closed) {
		rv = NNG_ECLOSED;
	} else {
		d->d_ref++;
		rv = 0;
	}
	nni_mtx_unlock(&dialers_lk);
	return (rv);
}